

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O3

uint64_t t1ha_ia32aes_avx(void *data,size_t len,uint64_t seed)

{
  undefined1 *puVar1;
  uint64_t uVar2;
  undefined1 (*pauVar3) [16];
  uint64_t uVar4;
  size_t sVar5;
  undefined1 (*pauVar6) [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  
  sVar5 = len;
  if (0x20 < len) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = seed;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = len;
    auVar7 = vpunpcklqdq_avx(auVar9,auVar7);
    auVar9 = aesenc(auVar7,_DAT_001b4500);
    pauVar6 = (undefined1 (*) [16])((len & 0xfffffffffffffff0) + (long)data);
    if ((len & 0x10) != 0) {
      auVar7 = vpaddq_avx(auVar7,*data);
      data = (void *)((long)data + 0x10);
      auVar9 = aesenc(auVar7,auVar9);
    }
    auVar10 = ZEXT1664(auVar9);
    pauVar3 = (undefined1 (*) [16])((long)data + 0x70);
    while (auVar8 = ZEXT1664(auVar7), pauVar3 < pauVar6) {
      auVar11 = aesenc(*data,auVar9);
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x10));
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x20));
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x30));
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x40));
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x50));
      auVar11 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x60));
      auVar12 = aesdec(auVar11,*(undefined1 (*) [16])((long)data + 0x70));
      auVar11 = auVar10._0_16_;
      auVar12 = aesenc(auVar7,auVar12);
      auVar10._0_32_ = ZEXT1632(auVar12);
      auVar9 = vpaddq_avx(auVar9,_DAT_001b4510);
      auVar7 = vpaddq_avx(auVar11,auVar7);
      pauVar3 = (undefined1 (*) [16])((long)data + 0xf0);
      data = (undefined1 (*) [16])((long)data + 0x80);
    }
    len = (size_t)((uint)len & 0xf);
    while( true ) {
      auVar9 = auVar10._0_16_;
      auVar7 = auVar8._0_16_;
      if (pauVar6 <= data) break;
      auVar11 = vpaddq_avx(auVar9,*data);
      auVar12 = vpsubq_avx(auVar7,*(undefined1 (*) [16])((long)data + 0x10));
      auVar7 = aesdec(auVar7,auVar11);
      auVar8._0_32_ = ZEXT1632(auVar7);
      data = (void *)((long)data + 0x20);
      auVar7 = aesdec(auVar9,auVar12);
      auVar10._0_32_ = ZEXT1632(auVar7);
    }
    auVar11 = aesenc(auVar9,auVar7);
    auVar7 = aesdec(auVar7,auVar11);
    auVar7 = vpaddq_avx(auVar7,auVar9);
    seed = auVar7._0_8_;
    sVar5 = vpextrq_avx(auVar7,1);
    data = pauVar6;
  }
  switch(len) {
  default:
    puVar1 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    uVar2 = mux64(*(uint64_t *)puVar1,0x9c06faf4d023e3ab);
    sVar5 = sVar5 + uVar2;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    puVar1 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    uVar2 = mux64(*(uint64_t *)puVar1,0xbd9cacc22c6e9571);
    seed = seed + uVar2;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    puVar1 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    uVar2 = mux64(*(uint64_t *)puVar1,0xd4f06db99d67be4b);
    sVar5 = sVar5 + uVar2;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar2 = tail64_le(data,len);
    uVar2 = mux64(uVar2,0x82434fe90edcef39);
    seed = seed + uVar2;
  case 0:
    uVar2 = rot64(seed + sVar5,0x11);
    uVar4 = 0x9c06faf4d023e3ab;
    uVar2 = mux64(uVar2,0x9c06faf4d023e3ab);
    uVar4 = mix(seed ^ sVar5,uVar4);
    return uVar4 + uVar2;
  }
}

Assistant:

static uint64_t __attribute__((target("aes,avx")))
t1ha_ia32aes_avx(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(p0, p1));

    const __m128i *v = (const __m128i *)data;
    const __m128i *const detent =
        (const __m128i *)((const uint8_t *)data + (len & ~15ul));
    data = detent;

    if (len & 16) {
      x = _mm_add_epi64(x, _mm_loadu_si128(v++));
      y = _mm_aesenc_si128(x, y);
    }
    len &= 15;

    if (v + 7 < detent) {
      __m128i salt = y;
      do {
        __m128i t = _mm_aesenc_si128(_mm_loadu_si128(v++), salt);
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        salt = _mm_add_epi64(salt, _mm_set_epi64x(p2, p3));
        t = _mm_aesenc_si128(x, t);
        x = _mm_add_epi64(y, x);
        y = t;
      } while (v + 7 < detent);
    }

    while (v < detent) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
    a = _mm_cvtsi128_si64(x);
#if defined(__SSE4_1__)
    b = _mm_extract_epi64(x, 1);
#else
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
#if defined(__SSE4_1__)
    a |= (uint64_t)_mm_extract_epi32(x, 1) << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) |
        (uint64_t)_mm_extract_epi32(x, 3) << 32;
#else
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    b += mux64(*v++, p4);
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    a += mux64(*v++, p3);
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    b += mux64(*v++, p2);
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    a += mux64(tail64_le(v, len), p1);
  case 0:
    return mux64(rot64(a + b, s1), p4) + mix(a ^ b, p0);
  }
}